

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_image.cpp
# Opt level: O3

uint32_t spvtools::val::anon_unknown_0::GetMinCoordSize(Op opcode,ImageTypeInfo *info)

{
  bool bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  
  if ((info->dim != Cube) ||
     ((uVar3 = 3, 1 < opcode - OpImageRead && (opcode != OpImageSparseRead)))) {
    uVar2 = GetPlaneCoordSize((ImageTypeInfo *)(ulong)info->dim);
    uVar3 = info->arrayed;
    bVar1 = IsProj(opcode);
    uVar3 = (uint)bVar1 + uVar2 + uVar3;
  }
  return uVar3;
}

Assistant:

uint32_t GetMinCoordSize(spv::Op opcode, const ImageTypeInfo& info) {
  if (info.dim == spv::Dim::Cube &&
      (opcode == spv::Op::OpImageRead || opcode == spv::Op::OpImageWrite ||
       opcode == spv::Op::OpImageSparseRead)) {
    // These opcodes use UV for Cube, not direction vector.
    return 3;
  }

  return GetPlaneCoordSize(info) + info.arrayed + (IsProj(opcode) ? 1 : 0);
}